

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Atoi64(char *zNum,i64 *pNum,int length,u8 enc)

{
  ulong uVar1;
  char *pcVar2;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  undefined7 in_register_00000009;
  byte *pbVar8;
  byte *pbVar9;
  ulong uVar10;
  i64 iVar11;
  byte *pbVar12;
  uint uVar13;
  byte *pbVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  i64 iVar18;
  byte bVar19;
  i64 iVar20;
  bool bVar21;
  
  uVar13 = (uint)CONCAT71(in_register_00000009,enc);
  if (uVar13 == 1) {
    lVar16 = 1;
    bVar5 = false;
    pbVar8 = (byte *)zNum;
  }
  else {
    uVar15 = 3 - uVar13;
    uVar10 = (ulong)uVar15;
    bVar5 = (int)uVar15 < length;
    if (((int)uVar15 < length) &&
       (uVar10 = 3 - (CONCAT71(in_register_00000009,enc) & 0xffffffff), zNum[uVar10] == '\0')) {
      uVar10 = 5 - (ulong)enc;
      do {
        bVar5 = (long)uVar10 < (long)length;
        if ((long)length <= (long)uVar10) goto LAB_00141543;
        uVar1 = uVar10 + 2;
        pcVar2 = zNum + uVar10;
        uVar10 = uVar1;
      } while (*pcVar2 == '\0');
      uVar10 = (ulong)((int)uVar1 - 2);
    }
LAB_00141543:
    length = (uint)uVar10 ^ 1;
    pbVar8 = (byte *)(zNum + (uVar13 & 1));
    lVar16 = 2;
  }
  pbVar14 = (byte *)(zNum + length);
  for (; bVar4 = true, pbVar9 = pbVar8, pbVar8 < pbVar14; pbVar8 = pbVar8 + lVar16) {
    bVar19 = *pbVar8;
    if ((""[bVar19] & 1) == 0) {
      bVar4 = true;
      if (bVar19 == 0x2b) {
        pbVar8 = pbVar8 + lVar16;
        pbVar9 = pbVar8;
      }
      else if (bVar19 == 0x2d) {
        pbVar8 = pbVar8 + lVar16;
        bVar4 = false;
        pbVar9 = pbVar8;
      }
      break;
    }
  }
  for (; (pbVar8 < pbVar14 && (*pbVar8 == 0x30)); pbVar8 = pbVar8 + lVar16) {
  }
  bVar21 = pbVar14 <= pbVar8;
  if ((bVar21) || (bVar19 = *pbVar8, 9 < (byte)(bVar19 - 0x30))) {
    lVar17 = 0;
    uVar13 = 0;
  }
  else {
    lVar17 = 0;
    uVar13 = 0;
    pbVar12 = pbVar8;
    do {
      pbVar12 = pbVar12 + lVar16;
      lVar17 = (ulong)bVar19 + lVar17 * 10 + -0x30;
      uVar13 = uVar13 + (int)lVar16;
      bVar21 = pbVar14 <= pbVar12;
      if (bVar21) break;
      bVar19 = *pbVar12;
    } while ((byte)(bVar19 - 0x30) < 10);
  }
  iVar11 = -0x8000000000000000;
  iVar18 = -lVar17;
  iVar20 = iVar11;
  if (bVar4) {
    iVar20 = 0x7fffffffffffffff;
    iVar18 = lVar17;
  }
  if (lVar17 < 0) {
    iVar18 = iVar20;
  }
  *pNum = iVar18;
  if (uVar13 == 0) {
    bVar5 = (bool)(bVar5 | pbVar9 == pbVar8);
  }
  if (!bVar21 && bVar5 == false) {
    pbVar9 = pbVar8 + uVar13;
    do {
      bVar5 = (""[*pbVar9] & 1) == 0;
      if (bVar5) break;
      pbVar9 = pbVar9 + lVar16;
    } while (pbVar9 < pbVar14);
  }
  uVar15 = (int)lVar16 * 0x13;
  uVar6 = (uint)bVar5;
  if (uVar15 <= uVar13) {
    iVar7 = 1;
    if (uVar13 <= uVar15) {
      uVar10 = 0;
      pbVar14 = pbVar8;
      do {
        bVar19 = *pbVar14;
        bVar3 = "922337203685477580"[uVar10];
        if (0x10 < uVar10) break;
        uVar10 = uVar10 + 1;
        pbVar14 = pbVar14 + lVar16;
      } while (bVar19 == bVar3);
      if (bVar19 == bVar3) {
        iVar7 = (char)pbVar8[lVar16 * 0x12] + -0x38;
      }
      else {
        iVar7 = ((int)(char)bVar19 - (int)(char)bVar3) * 10;
      }
    }
    uVar6 = (uint)bVar5;
    if (-1 < iVar7) {
      if (bVar4) {
        iVar11 = 0x7fffffffffffffff;
      }
      *pNum = iVar11;
      uVar6 = (uint)bVar5;
      if (bVar4) {
        uVar6 = 3;
      }
      if (iVar7 != 0) {
        uVar6 = 2;
      }
    }
  }
  return uVar6;
}

Assistant:

SQLITE_PRIVATE int sqlite3Atoi64(const char *zNum, i64 *pNum, int length, u8 enc){
  int incr;
  u64 u = 0;
  int neg = 0; /* assume positive */
  int i;
  int c = 0;
  int nonNum = 0;  /* True if input contains UTF16 with high byte non-zero */
  int rc;          /* Baseline return code */
  const char *zStart;
  const char *zEnd = zNum + length;
  assert( enc==SQLITE_UTF8 || enc==SQLITE_UTF16LE || enc==SQLITE_UTF16BE );
  if( enc==SQLITE_UTF8 ){
    incr = 1;
  }else{
    incr = 2;
    assert( SQLITE_UTF16LE==2 && SQLITE_UTF16BE==3 );
    for(i=3-enc; i<length && zNum[i]==0; i+=2){}
    nonNum = i<length;
    zEnd = &zNum[i^1];
    zNum += (enc&1);
  }
  while( zNum<zEnd && sqlite3Isspace(*zNum) ) zNum+=incr;
  if( zNum<zEnd ){
    if( *zNum=='-' ){
      neg = 1;
      zNum+=incr;
    }else if( *zNum=='+' ){
      zNum+=incr;
    }
  }
  zStart = zNum;
  while( zNum<zEnd && zNum[0]=='0' ){ zNum+=incr; } /* Skip leading zeros. */
  for(i=0; &zNum[i]<zEnd && (c=zNum[i])>='0' && c<='9'; i+=incr){
    u = u*10 + c - '0';
  }
  testcase( i==18*incr );
  testcase( i==19*incr );
  testcase( i==20*incr );
  if( u>LARGEST_INT64 ){
    /* This test and assignment is needed only to suppress UB warnings
    ** from clang and -fsanitize=undefined.  This test and assignment make
    ** the code a little larger and slower, and no harm comes from omitting
    ** them, but we must appaise the undefined-behavior pharisees. */
    *pNum = neg ? SMALLEST_INT64 : LARGEST_INT64;
  }else if( neg ){
    *pNum = -(i64)u;
  }else{
    *pNum = (i64)u;
  }
  rc = 0;
  if( (i==0 && zStart==zNum)     /* No digits */
   || nonNum                     /* UTF16 with high-order bytes non-zero */
  ){
    rc = 1;
  }else if( &zNum[i]<zEnd ){     /* Extra bytes at the end */
    int jj = i;
    do{
      if( !sqlite3Isspace(zNum[jj]) ){
        rc = 1;          /* Extra non-space text after the integer */
        break;
      }
      jj += incr;
    }while( &zNum[jj]<zEnd );
  }
  if( i<19*incr ){
    /* Less than 19 digits, so we know that it fits in 64 bits */
    assert( u<=LARGEST_INT64 );
    return rc;
  }else{
    /* zNum is a 19-digit numbers.  Compare it against 9223372036854775808. */
    c = i>19*incr ? 1 : compare2pow63(zNum, incr);
    if( c<0 ){
      /* zNum is less than 9223372036854775808 so it fits */
      assert( u<=LARGEST_INT64 );
      return rc;
    }else{
      *pNum = neg ? SMALLEST_INT64 : LARGEST_INT64;
      if( c>0 ){
        /* zNum is greater than 9223372036854775808 so it overflows */
        return 2;
      }else{
        /* zNum is exactly 9223372036854775808.  Fits if negative.  The
        ** special case 2 overflow if positive */
        assert( u-1==LARGEST_INT64 );
        return neg ? rc : 3;
      }
    }
  }
}